

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_christmas_event.hpp
# Opt level: O2

void __thiscall PatchChristmasEvent::load_from_rom(PatchChristmasEvent *this,ROM *rom)

{
  undefined1 local_58 [16];
  pointer local_48;
  pointer pSStack_40;
  pointer local_38;
  pointer pSStack_30;
  Color local_28 [2];
  Color aCStack_20 [2];
  
  ColorPalette<16UL>::from_rom((ColorPalette<16UL> *)local_58,rom,0x3deca);
  *(Color (*) [2])((this->_title_palette).super_array<Color,_16UL>._M_elems + 0xc) = local_28;
  *(Color (*) [2])((this->_title_palette).super_array<Color,_16UL>._M_elems + 0xe) = aCStack_20;
  *(pointer *)((this->_title_palette).super_array<Color,_16UL>._M_elems + 8) = local_38;
  *(pointer *)((this->_title_palette).super_array<Color,_16UL>._M_elems + 10) = pSStack_30;
  *(pointer *)((this->_title_palette).super_array<Color,_16UL>._M_elems + 4) = local_48;
  *(pointer *)((this->_title_palette).super_array<Color,_16UL>._M_elems + 6) = pSStack_40;
  *(undefined8 *)(this->_title_palette).super_array<Color,_16UL>._M_elems = local_58._0_8_;
  *(undefined8 *)((this->_title_palette).super_array<Color,_16UL>._M_elems + 2) = local_58._8_8_;
  Sprite::decode_from((Sprite *)local_58,
                      (rom->_byte_array).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x151cc4);
  Sprite::operator=(&this->_moneybag_sprite,(Sprite *)local_58);
  Sprite::~Sprite((Sprite *)local_58);
  return;
}

Assistant:

void load_from_rom(const md::ROM& rom) override
    {
        _title_palette = ColorPalette<16>::from_rom(rom, 0x3DECA);

        constexpr uint32_t MONEYBAG_SPRITE_ADDR = 0x151CC4;
        _moneybag_sprite = Sprite::decode_from(rom.iterator_at(MONEYBAG_SPRITE_ADDR));
    }